

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int geopolyUpdate(sqlite3_vtab *pVtab,int nData,sqlite3_value **aData,sqlite_int64 *pRowid)

{
  uint uVar1;
  uint uVar2;
  Mem *pMem;
  sqlite3_stmt *pStmt;
  RtreeNode *pNode;
  int iVar3;
  int iVar4;
  i64 iDelete;
  i64 iVar5;
  char *pcVar6;
  GeoPoly *p;
  sqlite3_value *psVar7;
  byte bVar8;
  ulong uVar9;
  byte bVar10;
  ulong uVar11;
  byte bVar12;
  long in_FS_OFFSET;
  RtreeNode *pLeaf;
  int rc;
  RtreeCell local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  rc = 0;
  iVar3 = 0x206;
  if (*(int *)((long)&pVtab[3].zErrMsg + 4) != 0) goto LAB_001df683;
  local_68.aCoord[4].i = -1;
  local_68.aCoord[5].i = -1;
  local_68.aCoord[6].i = -1;
  local_68.aCoord[7].i = -1;
  local_68.aCoord[8] = (RtreeCoord)0xffffffff;
  local_68.aCoord[9] = (RtreeCoord)0xffffffff;
  local_68.aCoord[0].i = -1;
  local_68.aCoord[1].i = -1;
  local_68.aCoord[2].i = -1;
  local_68.aCoord[3].i = -1;
  *(int *)&pVtab[3].pModule = *(int *)&pVtab[3].pModule + 1;
  pMem = *aData;
  uVar1._0_2_ = pMem->flags;
  uVar1._2_1_ = pMem->enc;
  uVar1._3_1_ = pMem->eSubtype;
  uVar9 = 0x5555555555555555 >> ((byte)(undefined2)uVar1 & 0x3f);
  if ((0x5555555555555555U >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
    iDelete = 0;
  }
  else {
    iDelete = sqlite3VdbeIntValue(pMem);
  }
  bVar8 = (byte)uVar9;
  if (nData < 2) {
    local_68.iRowid = 0;
    bVar10 = 0;
    bVar12 = 0;
LAB_001df3d0:
    if ((nData == 1) || (iVar3 = 0, (bVar8 & bVar12) != 0)) {
      iVar3 = rtreeDeleteRowid((Rtree *)pVtab,iDelete);
      rc = iVar3;
    }
    if ((bVar12 & 1 < nData & iVar3 == 0) == 1) {
      pLeaf = (RtreeNode *)0x0;
      if (bVar10 == 0) {
        iVar3 = rtreeNewRowid((Rtree *)pVtab,&local_68.iRowid);
        *pRowid = local_68.iRowid;
        rc = iVar3;
        if (iVar3 != 0) goto LAB_001df4e7;
      }
      else {
        *pRowid = local_68.iRowid;
      }
      rc = ChooseLeaf((Rtree *)pVtab,&local_68,0,&pLeaf);
      pNode = pLeaf;
      iVar3 = rc;
      if (rc == 0) {
        rc = rtreeInsertCell((Rtree *)pVtab,pLeaf,&local_68,0);
        iVar4 = nodeRelease((Rtree *)pVtab,pNode);
        iVar3 = rc;
        if (rc == 0) {
          iVar3 = iVar4;
          rc = iVar4;
        }
      }
    }
LAB_001df4e7:
    if ((1 < nData) && (iVar3 == 0)) {
      pStmt = (sqlite3_stmt *)pVtab[7].zErrMsg;
      iVar3 = 1;
      sqlite3_bind_int64(pStmt,1,local_68.iRowid);
      psVar7 = aData[2];
      if ((~psVar7->flags & 0x401) == 0) {
        sqlite3_bind_null(pStmt,2);
        iVar3 = 0;
      }
      else {
        if ((0x4000000040004U >> ((ulong)psVar7->flags & 0x3f) & 1) == 0) {
          p = (GeoPoly *)0x0;
LAB_001df627:
          sqlite3_bind_value(pStmt,2,psVar7);
        }
        else {
          p = geopolyFuncParam((sqlite3_context *)0x0,psVar7,&rc);
          if ((p == (GeoPoly *)0x0) || (rc != 0)) {
            psVar7 = aData[2];
            goto LAB_001df627;
          }
          sqlite3_bind_blob(pStmt,2,p->hdr,p->nVertex * 8 + 4,
                            (_func_void_void_ptr *)0xffffffffffffffff);
        }
        sqlite3_free(p);
      }
      for (uVar9 = 1; uVar9 < nData - 2; uVar9 = uVar9 + 1) {
        sqlite3_bind_value(pStmt,(int)uVar9 + 2,aData[uVar9 + 2]);
      }
      if (iVar3 + (int)uVar9 != 1) {
        sqlite3_step(pStmt);
        rc = sqlite3_reset(pStmt);
      }
    }
  }
  else {
    uVar11 = 0x5555555555555555 >> ((byte)aData[1]->flags & 0x3f);
    bVar10 = (byte)uVar11 & 1;
    if ((uVar11 & 1) == 0) {
      iVar5 = 0;
    }
    else {
      iVar5 = sqlite3VdbeIntValue(aData[1]);
    }
    psVar7 = aData[2];
    local_68.iRowid = iVar5;
    if (((uVar9 & 1) != 0) &&
       (uVar2._0_2_ = psVar7->flags, uVar2._2_1_ = psVar7->enc, uVar2._3_1_ = psVar7->eSubtype,
       (~uVar2 & 0x401) == 0 && iDelete == iVar5)) {
      bVar12 = 0;
      goto LAB_001df3d0;
    }
    geopolyBBox((sqlite3_context *)0x0,psVar7,local_68.aCoord,&rc);
    if (rc == 0) {
      bVar12 = 1;
      if (((uVar11 & 1) != 0) && ((iDelete == iVar5 & bVar8) == 0)) {
        sqlite3_bind_int64((sqlite3_stmt *)pVtab[5].zErrMsg,1,local_68.iRowid);
        iVar3 = sqlite3_step((sqlite3_stmt *)pVtab[5].zErrMsg);
        rc = sqlite3_reset((sqlite3_stmt *)pVtab[5].zErrMsg);
        if (iVar3 == 100) {
          if (*(char *)((long)&(pVtab[1].pModule)->xUpdate + 4) == '\x05') {
            rc = rtreeDeleteRowid((Rtree *)pVtab,local_68.iRowid);
          }
          else {
            rc = rtreeConstraintError((Rtree *)pVtab,0);
          }
        }
        bVar12 = 1;
        if (rc != 0) goto LAB_001df676;
      }
      goto LAB_001df3d0;
    }
    if (rc == 1) {
      pcVar6 = sqlite3_mprintf("_shape does not contain a valid polygon");
      pVtab->zErrMsg = pcVar6;
    }
  }
LAB_001df676:
  rtreeRelease((Rtree *)pVtab);
  iVar3 = rc;
LAB_001df683:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

static int geopolyUpdate(
  sqlite3_vtab *pVtab,
  int nData,
  sqlite3_value **aData,
  sqlite_int64 *pRowid
){
  Rtree *pRtree = (Rtree *)pVtab;
  int rc = SQLITE_OK;
  RtreeCell cell;                 /* New cell to insert if nData>1 */
  i64 oldRowid;                   /* The old rowid */
  int oldRowidValid;              /* True if oldRowid is valid */
  i64 newRowid;                   /* The new rowid */
  int newRowidValid;              /* True if newRowid is valid */
  int coordChange = 0;            /* Change in coordinates */

  if( pRtree->nNodeRef ){
    /* Unable to write to the btree while another cursor is reading from it,
    ** since the write might do a rebalance which would disrupt the read
    ** cursor. */
    return SQLITE_LOCKED_VTAB;
  }
  rtreeReference(pRtree);
  assert(nData>=1);

  oldRowidValid = sqlite3_value_type(aData[0])!=SQLITE_NULL;;
  oldRowid = oldRowidValid ? sqlite3_value_int64(aData[0]) : 0;
  newRowidValid = nData>1 && sqlite3_value_type(aData[1])!=SQLITE_NULL;
  newRowid = newRowidValid ? sqlite3_value_int64(aData[1]) : 0;
  cell.iRowid = newRowid;

  if( nData>1                                 /* not a DELETE */
   && (!oldRowidValid                         /* INSERT */
        || !sqlite3_value_nochange(aData[2])  /* UPDATE _shape */
        || oldRowid!=newRowid)                /* Rowid change */
  ){
    assert( aData[2]!=0 );
    geopolyBBox(0, aData[2], cell.aCoord, &rc);
    if( rc ){
      if( rc==SQLITE_ERROR ){
        pVtab->zErrMsg =
          sqlite3_mprintf("_shape does not contain a valid polygon");
      }
      goto geopoly_update_end;
    }
    coordChange = 1;

    /* If a rowid value was supplied, check if it is already present in
    ** the table. If so, the constraint has failed. */
    if( newRowidValid && (!oldRowidValid || oldRowid!=newRowid) ){
      int steprc;
      sqlite3_bind_int64(pRtree->pReadRowid, 1, cell.iRowid);
      steprc = sqlite3_step(pRtree->pReadRowid);
      rc = sqlite3_reset(pRtree->pReadRowid);
      if( SQLITE_ROW==steprc ){
        if( sqlite3_vtab_on_conflict(pRtree->db)==SQLITE_REPLACE ){
          rc = rtreeDeleteRowid(pRtree, cell.iRowid);
        }else{
          rc = rtreeConstraintError(pRtree, 0);
        }
      }
    }
  }

  /* If aData[0] is not an SQL NULL value, it is the rowid of a
  ** record to delete from the r-tree table. The following block does
  ** just that.
  */
  if( rc==SQLITE_OK && (nData==1 || (coordChange && oldRowidValid)) ){
    rc = rtreeDeleteRowid(pRtree, oldRowid);
  }

  /* If the aData[] array contains more than one element, elements
  ** (aData[2]..aData[argc-1]) contain a new record to insert into
  ** the r-tree structure.
  */
  if( rc==SQLITE_OK && nData>1 && coordChange ){
    /* Insert the new record into the r-tree */
    RtreeNode *pLeaf = 0;
    if( !newRowidValid ){
      rc = rtreeNewRowid(pRtree, &cell.iRowid);
    }
    *pRowid = cell.iRowid;
    if( rc==SQLITE_OK ){
      rc = ChooseLeaf(pRtree, &cell, 0, &pLeaf);
    }
    if( rc==SQLITE_OK ){
      int rc2;
      rc = rtreeInsertCell(pRtree, pLeaf, &cell, 0);
      rc2 = nodeRelease(pRtree, pLeaf);
      if( rc==SQLITE_OK ){
        rc = rc2;
      }
    }
  }

  /* Change the data */
  if( rc==SQLITE_OK && nData>1 ){
    sqlite3_stmt *pUp = pRtree->pWriteAux;
    int jj;
    int nChange = 0;
    sqlite3_bind_int64(pUp, 1, cell.iRowid);
    assert( pRtree->nAux>=1 );
    if( sqlite3_value_nochange(aData[2]) ){
      sqlite3_bind_null(pUp, 2);
    }else{
      GeoPoly *p = 0;
      if( sqlite3_value_type(aData[2])==SQLITE_TEXT
       && (p = geopolyFuncParam(0, aData[2], &rc))!=0
       && rc==SQLITE_OK
      ){
        sqlite3_bind_blob(pUp, 2, p->hdr, 4+8*p->nVertex, SQLITE_TRANSIENT);
      }else{
        sqlite3_bind_value(pUp, 2, aData[2]);
      }
      sqlite3_free(p);
      nChange = 1;
    }
    for(jj=1; jj<nData-2; jj++){
      nChange++;
      sqlite3_bind_value(pUp, jj+2, aData[jj+2]);
    }
    if( nChange ){
      sqlite3_step(pUp);
      rc = sqlite3_reset(pUp);
    }
  }

geopoly_update_end:
  rtreeRelease(pRtree);
  return rc;
}